

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const,Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>const,-1,1,true>const>>,0,0>
       ::
       run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,true>const>>
                 (redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
                  *eval,scalar_sum_op<double,_double> *func,
                 CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>
                 *xpr)

{
  bool bVar1;
  long lVar2;
  CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>
  *pCVar3;
  Index IVar4;
  Index IVar5;
  CoeffReturnType local_50;
  long local_48;
  Index j;
  Index i_1;
  long local_30;
  Index i;
  Scalar res;
  CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>
  *xpr_local;
  scalar_sum_op<double,_double> *func_local;
  redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
  *eval_local;
  
  res = (Scalar)xpr;
  xpr_local = (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>
               *)func;
  func_local = (scalar_sum_op<double,_double> *)eval;
  IVar4 = CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_true>_>
          ::rows(xpr);
  bVar1 = false;
  if (0 < IVar4) {
    IVar4 = CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_true>_>
            ::cols((CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>
                    *)res);
    bVar1 = false;
    if (0 < IVar4) {
      bVar1 = true;
    }
  }
  if (!bVar1) {
    __assert_fail("xpr.rows()>0 && xpr.cols()>0 && \"you are using an empty matrix\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Redux.h"
                  ,200,
                  "static Scalar Eigen::internal::redux_impl<Eigen::internal::scalar_sum_op<double>, Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>, const Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1, true>>>>::run(const Evaluator &, const Func &, const XprType &) [Func = Eigen::internal::scalar_sum_op<double>, Evaluator = Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>, const Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1, true>>>, Traversal = 0, Unrolling = 0, XprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>, const Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1, true>>]"
                 );
  }
  i = (Index)redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_true>_>_>
             ::coeffByOuterInner((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
                                  *)func_local,0,0);
  local_30 = 1;
  while( true ) {
    lVar2 = local_30;
    IVar4 = DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_true>_>_>
            ::innerSize((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
                         *)res);
    pCVar3 = xpr_local;
    if (IVar4 <= lVar2) break;
    i_1 = (Index)redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_true>_>_>
                 ::coeffByOuterInner((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
                                      *)func_local,0,local_30);
    i = (Index)scalar_sum_op<double,_double>::operator()
                         ((scalar_sum_op<double,_double> *)pCVar3,(double *)&i,(double *)&i_1);
    local_30 = local_30 + 1;
  }
  j = 1;
  while( true ) {
    IVar4 = j;
    IVar5 = DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_true>_>_>
            ::outerSize((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
                         *)res);
    if (IVar5 <= IVar4) break;
    local_48 = 0;
    while( true ) {
      lVar2 = local_48;
      IVar4 = DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_true>_>_>
              ::innerSize((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
                           *)res);
      pCVar3 = xpr_local;
      if (IVar4 <= lVar2) break;
      local_50 = redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_true>_>_>
                 ::coeffByOuterInner((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_true>_>_>
                                      *)func_local,j,local_48);
      i = (Index)scalar_sum_op<double,_double>::operator()
                           ((scalar_sum_op<double,_double> *)pCVar3,(double *)&i,&local_50);
      local_48 = local_48 + 1;
    }
    j = j + 1;
  }
  return (Scalar)i;
}

Assistant:

EIGEN_DEVICE_FUNC static EIGEN_STRONG_INLINE
  Scalar run(const Evaluator &eval, const Func& func, const XprType& xpr)
  {
    eigen_assert(xpr.rows()>0 && xpr.cols()>0 && "you are using an empty matrix");
    Scalar res;
    res = eval.coeffByOuterInner(0, 0);
    for(Index i = 1; i < xpr.innerSize(); ++i)
      res = func(res, eval.coeffByOuterInner(0, i));
    for(Index i = 1; i < xpr.outerSize(); ++i)
      for(Index j = 0; j < xpr.innerSize(); ++j)
        res = func(res, eval.coeffByOuterInner(i, j));
    return res;
  }